

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O0

void __thiscall
cfgfile::tag_scalar_t<bool,_cfgfile::string_trait_t>::on_string
          (tag_scalar_t<bool,_cfgfile::string_trait_t> *this,
          parser_info_t<cfgfile::string_trait_t> *info,string_t *str)

{
  bool bVar1;
  undefined8 uVar2;
  parser_info_t<cfgfile::string_trait_t> *in_RSI;
  tag_t<cfgfile::string_trait_t> *in_RDI;
  string *in_stack_fffffffffffffae8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaf0;
  allocator *paVar3;
  string_t *in_stack_fffffffffffffaf8;
  allocator *paVar4;
  tag_t<cfgfile::string_trait_t> *in_stack_fffffffffffffb00;
  exception_t<cfgfile::string_trait_t> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb28;
  allocator local_4a9;
  string local_4a8 [103];
  allocator local_441;
  string local_440 [71];
  undefined1 local_3f9 [72];
  allocator local_3b1;
  string local_3b0 [208];
  string_t *in_stack_fffffffffffffd20;
  parser_info_t<cfgfile::string_trait_t> *in_stack_fffffffffffffd28;
  allocator local_2a9;
  string local_2a8 [103];
  allocator local_241;
  string local_240 [71];
  allocator local_1f9;
  string local_1f8 [71];
  allocator local_1b1;
  string local_1b0 [87];
  allocator local_159;
  string local_158 [328];
  parser_info_t<cfgfile::string_trait_t> *local_10;
  
  local_10 = in_RSI;
  bVar1 = tag_t<cfgfile::string_trait_t>::is_defined_member_value(in_RDI);
  if (bVar1) {
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3b0,"Value for the tag \"",&local_3b1);
    string_trait_t::from_ascii(in_stack_fffffffffffffae8);
    tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(in_RDI);
    std::operator+(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
    this_00 = (exception_t<cfgfile::string_trait_t> *)local_3f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_3f9 + 1),"\" already defined. In file \"",(allocator *)this_00);
    string_trait_t::from_ascii(in_stack_fffffffffffffae8);
    std::operator+(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    parser_info_t<cfgfile::string_trait_t>::file_name_abi_cxx11_(local_10);
    std::operator+(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
    paVar4 = &local_441;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_440,"\" on line ",paVar4);
    string_trait_t::from_ascii(in_stack_fffffffffffffae8);
    std::operator+(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    parser_info_t<cfgfile::string_trait_t>::line_number(local_10);
    string_trait_t::to_string_abi_cxx11_((pos_t)in_stack_fffffffffffffae8);
    std::operator+(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    paVar3 = &local_4a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4a8,".",paVar3);
    string_trait_t::from_ascii(in_stack_fffffffffffffae8);
    std::operator+(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    exception_t<cfgfile::string_trait_t>::exception_t(this_00,(string_t *)paVar4);
    __cxa_throw(uVar2,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  bVar1 = tag_t<cfgfile::string_trait_t>::is_any_child_defined(in_stack_fffffffffffffb00);
  if (!bVar1) {
    bVar1 = format_t<bool,_cfgfile::string_trait_t>::from_string
                      (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
    *(bool *)&in_RDI[1]._vptr_tag_t = bVar1;
    tag_t<cfgfile::string_trait_t>::set_defined(in_RDI,true);
    return;
  }
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"Value \"",&local_159);
  string_trait_t::from_ascii(in_stack_fffffffffffffae8);
  std::operator+(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"\" for tag \"",&local_1b1);
  string_trait_t::from_ascii(in_stack_fffffffffffffae8);
  std::operator+(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
  tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(in_RDI);
  std::operator+(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
  paVar3 = &local_1f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1f8,"\" must be defined before any child tag. In file \"",paVar3);
  string_trait_t::from_ascii(in_stack_fffffffffffffae8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar3,
                 in_stack_fffffffffffffb20);
  parser_info_t<cfgfile::string_trait_t>::file_name_abi_cxx11_(local_10);
  std::operator+(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
  paVar4 = &local_241;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,"\" on line ",paVar4);
  string_trait_t::from_ascii(in_stack_fffffffffffffae8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar3,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar4);
  parser_info_t<cfgfile::string_trait_t>::line_number(local_10);
  string_trait_t::to_string_abi_cxx11_((pos_t)in_stack_fffffffffffffae8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar3,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a8,".",&local_2a9);
  string_trait_t::from_ascii(in_stack_fffffffffffffae8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar3,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar4);
  exception_t<cfgfile::string_trait_t>::exception_t
            ((exception_t<cfgfile::string_trait_t> *)in_stack_fffffffffffffb00,
             in_stack_fffffffffffffaf8);
  __cxa_throw(uVar2,&exception_t<cfgfile::string_trait_t>::typeinfo,
              exception_t<cfgfile::string_trait_t>::~exception_t);
}

Assistant:

void on_string( const parser_info_t< Trait > & info,
		const typename Trait::string_t & str ) override
	{
		if( !this->is_defined_member_value() )
		{
			if( this->is_any_child_defined() )
				throw exception_t< Trait >(
					Trait::from_ascii( "Value \"" ) + str +
					Trait::from_ascii( "\" for tag \"" ) + this->name() +
					Trait::from_ascii( "\" must be defined before any child "
						"tag. In file \"" ) +
					info.file_name() + Trait::from_ascii( "\" on line " ) +
					Trait::to_string( info.line_number() ) +
					Trait::from_ascii( "." ) );

			m_value = format_t< bool, Trait >::from_string( info, str );

			this->set_defined();
		}
		else
			throw exception_t< Trait >(
				Trait::from_ascii( "Value for the tag \"" ) +
				this->name() +
				Trait::from_ascii( "\" already defined. In file \"" ) +
				info.file_name() + Trait::from_ascii( "\" on line " ) +
				Trait::to_string( info.line_number() ) +
				Trait::from_ascii( "." ) );
	}